

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1bf255::DirectoryStructureInputNodeTask::start
          (DirectoryStructureInputNodeTask *this,TaskInterface ti)

{
  BuildNode *pBVar1;
  char *pcVar2;
  ulong uVar3;
  StringRef name;
  TaskInterface local_60;
  BuildKey local_50;
  long *local_30 [2];
  long local_20 [2];
  
  local_60.ctx = ti.ctx;
  local_60.impl = ti.impl;
  pBVar1 = this->node;
  pcVar2 = (pBVar1->super_Node).name._M_dataplus._M_p;
  uVar3 = (pBVar1->super_Node).name._M_string_length;
  if ((((uVar3 != 0) && (pcVar2[uVar3 - 1] == '/')) && ((uVar3 != 1 || (*pcVar2 != '/')))) &&
     (uVar3 - 1 <= uVar3)) {
    uVar3 = uVar3 - 1;
  }
  name.Length = uVar3;
  name.Data = pcVar2;
  llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
            (&local_50,'s',name,&pBVar1->exclusionPatterns);
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,local_50.key.key._M_dataplus._M_p,
             local_50.key.key._M_dataplus._M_p + local_50.key.key._M_string_length);
  llbuild::core::TaskInterface::request(&local_60,(KeyType *)local_30,0);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
    operator_delete(local_50.key.key._M_dataplus._M_p,
                    local_50.key.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Remove any trailing slash from the node name.
    StringRef path =  node.getName();
    if (path.endswith("/") && path != "/") {
      path = path.substr(0, path.size() - 1);
    }
    ti.request(BuildKey::makeDirectoryTreeStructureSignature(path,
                 node.contentExclusionPatterns()).toData(),
               /*inputID=*/0);
  }